

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-blend.c
# Opt level: O0

void composition_solid_source_over(uint32_t *dest,int length,uint32_t color,uint32_t const_alpha)

{
  uint32_t uVar1;
  int local_24;
  int i;
  uint32_t ialpha;
  uint32_t const_alpha_local;
  uint32_t color_local;
  int length_local;
  uint32_t *dest_local;
  
  ialpha = color;
  if (const_alpha != 0xff) {
    ialpha = BYTE_MUL(color,const_alpha);
  }
  for (local_24 = 0; local_24 < length; local_24 = local_24 + 1) {
    uVar1 = BYTE_MUL(dest[local_24],0xff - (ialpha >> 0x18));
    dest[local_24] = ialpha + uVar1;
  }
  return;
}

Assistant:

static void composition_solid_source_over(uint32_t* dest, int length, uint32_t color, uint32_t const_alpha)
{
    if(const_alpha != 255)
        color = BYTE_MUL(color, const_alpha);
    uint32_t ialpha = 255 - plutovg_alpha(color);
    for(int i = 0; i < length; i++) {
        dest[i] = color + BYTE_MUL(dest[i], ialpha);
    }
}